

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O1

ValueType ValueType::FromObjectWithArray(DynamicObject *object)

{
  code *pcVar1;
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar3;
  undefined4 *puVar4;
  JavascriptArray *objectArray;
  ArrayObject *obj;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a [4];
  ValueType valueType;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x564,"(object)","object");
    if (!bVar2) goto LAB_00b2293c;
    *puVar4 = 0;
  }
  if ((object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject != (_func_int **)VirtualTableInfo<Js::DynamicObject>::Address) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x565,"(VirtualTableInfo<DynamicObject>::HasVirtualTable(object))",
                       "VirtualTableInfo<DynamicObject>::HasVirtualTable(object)");
    if (!bVar2) goto LAB_00b2293c;
    *puVar4 = 0;
  }
  if (((object->super_RecyclableObject).type.ptr)->typeId != TypeIds_Object) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x566,"(object->GetTypeId() == TypeIds_Object)",
                       "object->GetTypeId() == TypeIds_Object");
    if (!bVar2) goto LAB_00b2293c;
    *puVar4 = 0;
  }
  bVar2 = Js::DynamicObject::HasObjectArray(object);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x567,"(object->HasObjectArray())","object->HasObjectArray()");
    if (!bVar2) goto LAB_00b2293c;
    *puVar4 = 0;
  }
  bVar2 = Js::DynamicObject::HasObjectArray(object);
  if (bVar2) {
    obj = *(ArrayObject **)&(object->field_1).field_1;
  }
  else {
    obj = (ArrayObject *)0x0;
  }
  if (obj == (ArrayObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x56a,"(objectArray)","objectArray");
    if (!bVar2) {
LAB_00b2293c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject ==
      (_func_int **)VirtualTableInfo<Js::JavascriptArray>::Address) {
    objectArray = Js::VarTo<Js::JavascriptArray,Js::ArrayObject>(obj);
    aVar3.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         FromObjectArray(objectArray);
    return (anon_union_2_4_ea848c7b_for_ValueType_13)
           (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
  }
  local_1a[0].bits = Object;
  SetObjectType((ValueType *)&local_1a[0].field_0,Object);
  aVar3.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       Verify(local_1a[0].field_0);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
}

Assistant:

ValueType ValueType::FromObjectWithArray(Js::DynamicObject *const object)
{
    using namespace Js;
    Assert(object);
    Assert(VirtualTableInfo<DynamicObject>::HasVirtualTable(object));
    Assert(object->GetTypeId() == TypeIds_Object); // this check should be a superset of the DynamicObject vtable check above
    Assert(object->HasObjectArray());

    ArrayObject *const objectArray = object->GetObjectArray();
    Assert(objectArray);
    if(!VirtualTableInfo<JavascriptArray>::HasVirtualTable(objectArray))
        return GetObject(ObjectType::Object);
    return FromObjectArray(VarTo<JavascriptArray>(objectArray));
}